

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O2

void __thiscall OpenMD::LangevinPiston::scaleSimBox(LangevinPiston *this)

{
  double s;
  Mat3x3d hmat;
  RectMatrix<double,_3U,_3U> local_58;
  
  s = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt * this->eta);
  if ((s <= 1.1) && (0.9 <= s)) {
    Snapshot::getHmat((Mat3x3d *)&local_58,
                      (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
    RectMatrix<double,_3U,_3U>::mul(&local_58,s);
    Snapshot::setHmat((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,
                      (Mat3x3d *)&local_58);
    return;
  }
  snprintf(painCave.errMsg,2000,
           "LangevinPiston error: Attempting a Box scaling of more than 10 percent\n check your tauBarostat, as it is probably too small!\n eta = %lf, scaleFactor = %lf\n"
           ,this->eta);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void LangevinPiston::scaleSimBox() {
    RealType scaleFactor;

    // This is from solving the first order equation that defines eta
    scaleFactor = exp(dt * eta);

    if ((scaleFactor > 1.1) || (scaleFactor < 0.9)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LangevinPiston error: Attempting a Box scaling of more than 10 "
               "percent\n"
               " check your tauBarostat, as it is probably too small!\n"
               " eta = %lf, scaleFactor = %lf\n",
               eta, scaleFactor);
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat *= scaleFactor;
      snap->setHmat(hmat);
    }
  }